

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteCursor::~SQLiteCursor(SQLiteCursor *this)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<2U> in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  string_view in_stack_00000040;
  int res;
  Level in_stack_00000120;
  char (*in_stack_00000130) [14];
  char **in_stack_00000138;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  LogFlags in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__SQLiteCursor_01616770;
  sqlite3_clear_bindings(in_RDI[1]);
  sqlite3_reset(in_RDI[1]);
  iVar2 = sqlite3_finalize(in_RDI[1]);
  if (iVar2 != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    sqlite3_errstr(iVar2);
    in_stack_ffffffffffffff88 = "~SQLiteCursor";
    in_stack_ffffffffffffff78 = 2;
    LogPrintFormatInternal<char[14],char_const*>
              (in_stack_00000040,(string_view)in_stack_00000030,in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe0,in_stack_00000120,in_stack_00000028,in_stack_00000130,
               in_stack_00000138);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff88);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff88);
  DatabaseCursor::~DatabaseCursor
            ((DatabaseCursor *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteCursor::~SQLiteCursor()
{
    sqlite3_clear_bindings(m_cursor_stmt);
    sqlite3_reset(m_cursor_stmt);
    int res = sqlite3_finalize(m_cursor_stmt);
    if (res != SQLITE_OK) {
        LogPrintf("%s: cursor closed but could not finalize cursor statement: %s\n",
                  __func__, sqlite3_errstr(res));
    }
}